

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O1

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::resetIndex(QGraphicsSceneBspTreeIndexPrivate *this)

{
  QGraphicsItem *pQVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QGraphicsItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  purgeRemovedItems(this);
  if ((this->indexedItems).d.size != 0) {
    uVar2 = 0;
    do {
      pQVar1 = (this->indexedItems).d.ptr[uVar2];
      if (pQVar1 != (QGraphicsItem *)0x0) {
        ((pQVar1->d_ptr).d)->index = -1;
        local_30 = pQVar1;
        QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                  ((QPodArrayOps<QGraphicsItem*> *)&this->unindexedItems,
                   (this->unindexedItems).d.size,&local_30);
        QList<QGraphicsItem_*>::end(&this->unindexedItems);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)(this->indexedItems).d.size);
  }
  QList<QGraphicsItem_*>::clear(&this->indexedItems);
  QList<int>::clear(&this->freeItemIndexes);
  QList<QGraphicsItem_*>::clear(&this->untransformableItems);
  this->regenerateIndex = true;
  if ((this->indexTimer).m_id == Invalid) {
    QBasicTimer::start(&this->indexTimer,2000000000,1,
                       *(undefined8 *)&(this->super_QGraphicsSceneIndexPrivate).field_0x8);
  }
  else {
    this->restartIndexTimer = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::resetIndex()
{
    purgeRemovedItems();
    for (int i = 0; i < indexedItems.size(); ++i) {
        if (QGraphicsItem *item = indexedItems.at(i)) {
            item->d_ptr->index = -1;
            Q_ASSERT(!item->d_ptr->itemDiscovered);
            unindexedItems << item;
        }
    }
    indexedItems.clear();
    freeItemIndexes.clear();
    untransformableItems.clear();
    regenerateIndex = true;
    startIndexTimer();
}